

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O2

void rxa2_fill_segment(argon2_instance_t *instance,argon2_position_t position)

{
  uint uVar1;
  block *pbVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint64_t *puVar6;
  int with_xor;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  argon2_position_t position_local;
  block zero_block;
  block input_block;
  block address_block;
  
  uVar7 = position._8_8_;
  uVar8 = position._0_8_;
  if (instance != (argon2_instance_t *)0x0) {
    position_local._0_8_ = uVar8;
    position_local._8_8_ = uVar7;
    if ((instance->type == Argon2_i) ||
       (position.slice < 2 && (instance->type == Argon2_id && position.pass == 0))) {
      rxa2_init_block_value(&zero_block,'\0');
      rxa2_init_block_value(&input_block,'\0');
      input_block.v[0] = uVar8 & 0xffffffff;
      input_block.v[2] = uVar7 & 0xff;
      input_block.v[3] = (uint64_t)instance->memory_blocks;
      input_block.v[4] = (uint64_t)instance->passes;
      input_block.v[5] = (uint64_t)instance->type;
      bVar3 = true;
      input_block.v[1] = uVar8 >> 0x20;
    }
    else {
      bVar3 = false;
    }
    bVar4 = position.slice == 0 && position.pass == 0;
    if ((bool)(bVar3 & bVar4)) {
      next_addresses(&address_block,&input_block,&zero_block);
      uVar9 = 2;
    }
    else {
      uVar9 = (uint)bVar4 * 2;
    }
    uVar1 = instance->segment_length;
    uVar11 = instance->lane_length;
    uVar10 = position.lane * uVar11 + uVar9 + (position._8_4_ & 0xff) * uVar1;
    uVar11 = (-(uint)(uVar10 % uVar11 != 0) | uVar11 - 1) + uVar10;
    for (; uVar9 < uVar1; uVar9 = uVar9 + 1) {
      if (uVar10 % instance->lane_length == 1) {
        uVar11 = uVar10 - 1;
      }
      if (bVar3) {
        if ((uVar9 & 0x7f) == 0) {
          next_addresses(&address_block,&input_block,&zero_block);
        }
        puVar6 = address_block.v + (uVar9 & 0x7f);
      }
      else {
        puVar6 = instance->memory[uVar11].v;
      }
      uVar7 = (*puVar6 >> 0x20) % (ulong)instance->lanes;
      uVar8 = uVar7;
      if (position_local.slice == '\0') {
        uVar8 = (ulong)position_local._0_8_ >> 0x20;
      }
      if (position_local.pass != 0) {
        uVar8 = uVar7;
      }
      position_local.index = uVar9;
      uVar5 = rxa2_index_alpha(instance,&position_local,(uint32_t)*puVar6,
                               (uint)(uVar8 == (ulong)position_local._0_8_ >> 0x20));
      pbVar2 = instance->memory;
      if ((instance->version == 0x10) || (position_local.pass == 0)) {
        with_xor = 0;
      }
      else {
        with_xor = 1;
      }
      fill_block(pbVar2 + uVar11,pbVar2 + instance->lane_length * uVar8 + (ulong)uVar5,
                 pbVar2 + uVar10,with_xor);
      uVar10 = uVar10 + 1;
      uVar11 = uVar11 + 1;
      uVar1 = instance->segment_length;
    }
  }
  return;
}

Assistant:

void rxa2_fill_segment(const argon2_instance_t *instance,
	argon2_position_t position) {
	block *ref_block = NULL, *curr_block = NULL;
	block address_block, input_block, zero_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index;
	uint32_t i;
	int data_independent_addressing;

	if (instance == NULL) {
		return;
	}

	data_independent_addressing =
		(instance->type == Argon2_i) ||
		(instance->type == Argon2_id && (position.pass == 0) &&
		(position.slice < ARGON2_SYNC_POINTS / 2));

	if (data_independent_addressing) {
		rxa2_init_block_value(&zero_block, 0);
		rxa2_init_block_value(&input_block, 0);

		input_block.v[0] = position.pass;
		input_block.v[1] = position.lane;
		input_block.v[2] = position.slice;
		input_block.v[3] = instance->memory_blocks;
		input_block.v[4] = instance->passes;
		input_block.v[5] = instance->type;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */

		/* Don't forget to generate the first block of addresses: */
		if (data_independent_addressing) {
			next_addresses(&address_block, &input_block, &zero_block);
		}
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		if (data_independent_addressing) {
			if (i % ARGON2_ADDRESSES_IN_BLOCK == 0) {
				next_addresses(&address_block, &input_block, &zero_block);
			}
			pseudo_rand = address_block.v[i % ARGON2_ADDRESSES_IN_BLOCK];
		}
		else {
			pseudo_rand = instance->memory[prev_offset].v[0];
		}

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = rxa2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(instance->memory + prev_offset, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 0);
			}
			else {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 1);
			}
		}
	}
}